

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.h
# Opt level: O0

void __thiscall
MinVR::VRDataIndex::_setValueSpecialized(VRDataIndex *this,VRDatumPtr *p,VRFloatArray *value)

{
  VRDatumFloatArray *this_00;
  vector<float,_std::allocator<float>_> *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  VRDatumPtr *in_stack_00000070;
  vector<float,_std::allocator<float>_> *inVal;
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>
  *in_stack_ffffffffffffffc0;
  vector<float,_std::allocator<float>_> local_30;
  
  this_00 = VRDatumPtr::floatArrayVal(in_stack_00000070);
  inVal = &local_30;
  std::vector<float,_std::allocator<float>_>::vector(in_RSI,in_RDX);
  VRDatumSpecialized<std::vector<float,_std::allocator<float>_>,_(MinVR::VRCORETYPE_ID)5>::setValue
            (in_stack_ffffffffffffffc0,inVal);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)this_00);
  return;
}

Assistant:

void _setValueSpecialized(VRDatumPtr p, VRFloatArray value) {
    p.floatArrayVal()->setValue(value);
  }